

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::apps::Recorder::getValue_abi_cxx11_
          (tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Recorder *this,size_t index)

{
  pointer pVVar1;
  TimeRepresentation<count_time<9,_long>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pVVar1 = (this->points).
           super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)(((long)(this->points).
                             super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x30)) {
    std::
    _Tuple_impl<0ul,TimeRepresentation<count_time<9,long>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
    ::
    _Tuple_impl<TimeRepresentation<count_time<9,long>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
              ((_Tuple_impl<0ul,TimeRepresentation<count_time<9,long>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                *)__return_storage_ptr__,&pVVar1[index].time,
               (this->targets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pVVar1[index].index,&pVVar1[index].value)
    ;
  }
  else {
    local_60.internalTimeCode = 0;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    CLI::std::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              (__return_storage_ptr__,&local_60,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Time, std::string_view, std::string> Recorder::getValue(std::size_t index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time, targets[points[index].index], points[index].value};
    }
    return {Time(), std::string(), std::string()};
}